

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O2

lws_mqtt_stateful_primitive_return_t lws_mqtt_str_parse(lws_mqtt_str_t *s,uint8_t **in,size_t *len)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  lws_mqtt_stateful_primitive_return_t lVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  ulong size;
  byte *pbVar9;
  byte *pbVar10;
  
  pbVar9 = *in;
  do {
    uVar7 = *len;
    if (uVar7 == 0) {
      pbVar10 = *in;
      uVar7 = 0;
LAB_0011ad59:
      *len = (size_t)(pbVar9 + (uVar7 - (long)pbVar10));
      if (s->buf == (uint8_t *)0x0) {
        lVar4 = LMSPR_NEED_MORE;
      }
      else {
        lVar4 = (lws_mqtt_stateful_primitive_return_t)(s->pos != s->len);
      }
      return lVar4;
    }
    if (s->len_valid != '\0') {
      uVar3 = *(int *)&s->len - (uint)s->pos;
      uVar6 = (uint)uVar7;
      if ((uVar3 & 0xffff) <= uVar7) {
        uVar6 = uVar3;
      }
      memcpy(s->buf + s->pos,*in,(ulong)(uVar6 & 0xffff));
      pbVar10 = *in + (uVar6 & 0xffff);
      *in = pbVar10;
      s->pos = s->pos + (short)uVar6;
      uVar7 = *len;
      goto LAB_0011ad59;
    }
    uVar1 = s->pos;
    pbVar10 = *in;
    if (1 < uVar1) goto LAB_0011ad59;
    uVar6._0_2_ = s->len;
    uVar6._2_2_ = s->limit;
    pbVar9 = pbVar10 + 1;
    *in = pbVar9;
    size = (ulong)((uVar6 & 0xff) << 8) | (ulong)*pbVar10;
    uVar8 = (ushort)size;
    s->len = uVar8;
    *len = uVar7 - 1;
    uVar2 = uVar1 + 1;
    s->pos = uVar2;
    if (uVar2 == 2) {
      if (s->limit < uVar8) {
        return LMSPR_FAILED_OVERSIZE;
      }
      s->pos = 0;
      s->len_valid = '\x01';
      if (uVar8 == 0) {
        return LMSPR_COMPLETED;
      }
      if (s->buf == (uint8_t *)0x0) {
        puVar5 = (uint8_t *)lws_realloc((void *)0x0,size,"lws_mqtt_str_parse");
        s->buf = puVar5;
        if (puVar5 == (uint8_t *)0x0) {
          return LMSPR_FAILED_OOM;
        }
        s->needs_freeing = '\x01';
      }
    }
  } while( true );
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_str_parse(lws_mqtt_str_t *s, const uint8_t **in, size_t *len)
{
	const uint8_t *oin = *in;

	/* handle the length + allocation if needed */
	while (*len && !s->len_valid && s->pos < 2) {
		s->len = (s->len << 8) | *((*in)++);
		(*len)--;
		oin = *in;
		if (++s->pos == 2) {
			if (s->len > s->limit)
				return LMSPR_FAILED_OVERSIZE;

			s->pos = 0;
			s->len_valid = 1;

			if (!s->len) /* do not need to allocate */
				return LMSPR_COMPLETED;

			if (!s->buf) {
				s->buf = lws_malloc(s->len, __func__);
				if (!s->buf)
					return LMSPR_FAILED_OOM;

				s->needs_freeing = 1;
			}
		}
	}

	/* handle copying bulk data into allocation */
	if (s->len_valid && *len) {
		uint16_t span = s->len - s->pos;

		if (span > *len)
			span = *len;

		memcpy(s->buf + s->pos, *in, span);
		*in += span;
		s->pos += span;
	}

	*len -= *in - oin;

	return s->buf && s->pos == s->len ? LMSPR_COMPLETED : LMSPR_NEED_MORE;
}